

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O0

Up __thiscall
yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType
          (PseudoDtErector *this,JsonObjVal *jsonDt,string *type,Up *attrs)

{
  string *psVar1;
  bool bVar2;
  unsigned_long_long uVar3;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *in_R8;
  TextParseError *exc;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_78 [3];
  allocator local_59;
  string local_58;
  unsigned_long_long local_38;
  unsigned_long_long minAlign;
  Up *attrs_local;
  string *type_local;
  JsonObjVal *jsonDt_local;
  PseudoDtErector *this_local;
  
  attrs_local = attrs;
  type_local = type;
  jsonDt_local = jsonDt;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"minimum-alignment",&local_59);
  uVar3 = JsonObjVal::getRawVal((JsonObjVal *)type,&local_58,1);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = uVar3;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          attrs_local,"static-length-array");
  psVar1 = type_local;
  if (bVar2) {
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
              (local_78,in_R8);
    _pseudoDtFromSlArrayType(this,jsonDt,(Up *)psVar1,(uint)local_78);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              (local_78);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            attrs_local,"dynamic-length-array");
    psVar1 = type_local;
    if (!bVar2) {
      __assert_fail("type == strs::dlArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/json/pseudo-dt-erector.cpp"
                    ,0x1c2,
                    "PseudoDt::Up yactfr::internal::PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal &, const std::string &, MapItem::Up)"
                   );
    }
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &exc,in_R8);
    _pseudoDtFromDlArrayType
              (this,jsonDt,(Up *)psVar1,
               (uint)(unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                      *)&exc);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               &exc);
  }
  return (__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
          )(__uniq_ptr_data<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>,_true,_true>
            )this;
}

Assistant:

PseudoDt::Up PseudoDtErector::_pseudoDtFromArrayType(const JsonObjVal& jsonDt,
                                                     const std::string& type,
                                                     MapItem::Up attrs)
{
    // minimum alignment
    const auto minAlign = jsonDt.getRawVal(strs::minAlign, 1ULL);

    try {
        if (type == strs::slArray) {
            return this->_pseudoDtFromSlArrayType(jsonDt, std::move(attrs), minAlign);
        } else {
            assert(type == strs::dlArray);
            return this->_pseudoDtFromDlArrayType(jsonDt, std::move(attrs), minAlign);
        }
    } catch (TextParseError& exc) {
        appendMsgToTextParseError(exc, "In array type:", jsonDt.loc());
        throw;
    }
}